

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

BOOL read_repeat_counts(PCRE2_SPTR8 *ptrptr,PCRE2_SPTR8 ptrend,uint32_t *minp,uint32_t *maxp,
                       int *errorcodeptr)

{
  BOOL BVar1;
  bool bVar2;
  uint32_t local_58;
  uint32_t local_54;
  int32_t max;
  int32_t min;
  BOOL had_minimum;
  BOOL yield;
  PCRE2_SPTR8 pp;
  PCRE2_SPTR8 p;
  int *errorcodeptr_local;
  uint32_t *maxp_local;
  uint32_t *minp_local;
  PCRE2_SPTR8 ptrend_local;
  PCRE2_SPTR8 *ptrptr_local;
  
  pp = *ptrptr;
  min = 0;
  max = 0;
  local_54 = 0;
  local_58 = 0x10000;
  *errorcodeptr = 0;
  while( true ) {
    bVar2 = false;
    if ((pp < ptrend) && (bVar2 = true, *pp != ' ')) {
      bVar2 = *pp == '\t';
    }
    if (!bVar2) break;
    pp = pp + 1;
  }
  _had_minimum = pp;
  if (((pp < ptrend) && (0x2f < *pp)) && (*pp < 0x3a)) {
    max = 1;
    do {
      _had_minimum = _had_minimum + 1;
      bVar2 = false;
      if ((_had_minimum < ptrend) && (bVar2 = false, 0x2f < *_had_minimum)) {
        bVar2 = *_had_minimum < 0x3a;
      }
    } while (bVar2);
  }
  while( true ) {
    bVar2 = false;
    if ((_had_minimum < ptrend) && (bVar2 = true, *_had_minimum != 0x20)) {
      bVar2 = *_had_minimum == 9;
    }
    if (!bVar2) break;
    _had_minimum = _had_minimum + 1;
  }
  if (ptrend <= _had_minimum) {
    return 0;
  }
  if (*_had_minimum == 0x7d) {
    if (max == 0) {
      return 0;
    }
  }
  else {
    if (*_had_minimum != 0x2c) {
      return 0;
    }
    do {
      _had_minimum = _had_minimum + 1;
      bVar2 = false;
      if ((_had_minimum < ptrend) && (bVar2 = true, *_had_minimum != 0x20)) {
        bVar2 = *_had_minimum == 9;
      }
    } while (bVar2);
    if (ptrend <= _had_minimum) {
      return 0;
    }
    if ((*_had_minimum < 0x30) || (0x39 < *_had_minimum)) {
      if (max == 0) {
        return 0;
      }
    }
    else {
      do {
        _had_minimum = _had_minimum + 1;
        bVar2 = false;
        if ((_had_minimum < ptrend) && (bVar2 = false, 0x2f < *_had_minimum)) {
          bVar2 = *_had_minimum < 0x3a;
        }
      } while (bVar2);
    }
    while( true ) {
      bVar2 = false;
      if ((_had_minimum < ptrend) && (bVar2 = true, *_had_minimum != 0x20)) {
        bVar2 = *_had_minimum == 9;
      }
      if (!bVar2) break;
      _had_minimum = _had_minimum + 1;
    }
    if ((ptrend <= _had_minimum) || (*_had_minimum != 0x7d)) {
      return 0;
    }
  }
  p = (PCRE2_SPTR8)errorcodeptr;
  errorcodeptr_local = (int *)maxp;
  maxp_local = minp;
  minp_local = (uint32_t *)ptrend;
  ptrend_local = (PCRE2_SPTR8)ptrptr;
  BVar1 = read_number(&pp,ptrend,-1,0xffff,0x69,(int *)&local_54,errorcodeptr);
  if (BVar1 == 0) {
    if (*(int *)p != 0) goto LAB_001d7cca;
    do {
      pp = pp + 1;
      bVar2 = false;
      if ((pp < minp_local) && (bVar2 = true, *pp != ' ')) {
        bVar2 = *pp == '\t';
      }
    } while (bVar2);
    BVar1 = read_number(&pp,(PCRE2_SPTR8)minp_local,-1,0xffff,0x69,(int *)&local_58,(int *)p);
    if ((BVar1 == 0) && (*(int *)p != 0)) goto LAB_001d7cca;
  }
  else {
    while( true ) {
      bVar2 = false;
      if ((pp < minp_local) && (bVar2 = true, *pp != ' ')) {
        bVar2 = *pp == '\t';
      }
      if (!bVar2) break;
      pp = pp + 1;
    }
    if (*pp == '}') {
      local_58 = local_54;
    }
    else {
      do {
        pp = pp + 1;
        bVar2 = false;
        if ((pp < minp_local) && (bVar2 = true, *pp != ' ')) {
          bVar2 = *pp == '\t';
        }
      } while (bVar2);
      BVar1 = read_number(&pp,(PCRE2_SPTR8)minp_local,-1,0xffff,0x69,(int *)&local_58,(int *)p);
      if ((BVar1 == 0) && (*(int *)p != 0)) goto LAB_001d7cca;
      if ((int)local_58 < (int)local_54) {
        p[0] = 'h';
        p[1] = '\0';
        p[2] = '\0';
        p[3] = '\0';
        goto LAB_001d7cca;
      }
    }
  }
  while( true ) {
    bVar2 = false;
    if ((pp < minp_local) && (bVar2 = true, *pp != ' ')) {
      bVar2 = *pp == '\t';
    }
    if (!bVar2) break;
    pp = pp + 1;
  }
  pp = pp + 1;
  min = 1;
  if (maxp_local != (uint32_t *)0x0) {
    *maxp_local = local_54;
  }
  if (errorcodeptr_local != (int *)0x0) {
    *errorcodeptr_local = local_58;
  }
LAB_001d7cca:
  *(PCRE2_SPTR8 *)ptrend_local = pp;
  return min;
}

Assistant:

static BOOL
read_repeat_counts(PCRE2_SPTR *ptrptr, PCRE2_SPTR ptrend, uint32_t *minp,
  uint32_t *maxp, int *errorcodeptr)
{
PCRE2_SPTR p = *ptrptr;
PCRE2_SPTR pp;
BOOL yield = FALSE;
BOOL had_minimum = FALSE;
int32_t min = 0;
int32_t max = REPEAT_UNLIMITED; /* This value is larger than MAX_REPEAT_COUNT */

*errorcodeptr = 0;
while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;

/* Check the syntax before interpreting. Otherwise, a non-quantifier sequence
such as "X{123456ABC" would incorrectly give a "number too big in quantifier"
error. */

pp = p;
if (pp < ptrend && IS_DIGIT(*pp))
  {
  had_minimum = TRUE;
  while (++pp < ptrend && IS_DIGIT(*pp)) {}
  }

while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
if (pp >= ptrend) return FALSE;

if (*pp == CHAR_RIGHT_CURLY_BRACKET)
  {
  if (!had_minimum) return FALSE;
  }
else
  {
  if (*pp++ != CHAR_COMMA) return FALSE;
  while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
  if (pp >= ptrend) return FALSE;
  if (IS_DIGIT(*pp))
    {
    while (++pp < ptrend && IS_DIGIT(*pp)) {}
    }
  else if (!had_minimum) return FALSE;
  while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
  if (pp >= ptrend || *pp != CHAR_RIGHT_CURLY_BRACKET) return FALSE;
  }

/* Now process the quantifier for real. We know it must be {n} or (n,} or {,m}
or {n,m}. The only error that read_number() can return is for a number that is
too big. If *errorcodeptr is returned as zero it means no number was found. */

/* Deal with {,m} or n too big. If we successfully read m there is no need to
check m >= n because n defaults to zero. */

if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &min, errorcodeptr))
  {
  if (*errorcodeptr != 0) goto EXIT;    /* n too big */
  p++;  /* Skip comma and subsequent spaces */
  while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
  if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &max, errorcodeptr))
    {
    if (*errorcodeptr != 0) goto EXIT;  /* m too big */
    }
  }

/* Have read one number. Deal with {n} or {n,} or {n,m} */

else
  {
  while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
  if (*p == CHAR_RIGHT_CURLY_BRACKET)
    {
    max = min;
    }
  else   /* Handle {n,} or {n,m} */
    {
    p++;    /* Skip comma and subsequent spaces */
    while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
    if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &max, errorcodeptr))
      {
      if (*errorcodeptr != 0) goto EXIT;   /* m too big */
      }

    if (max < min)
      {
      *errorcodeptr = ERR4;
      goto EXIT;
      }
    }
  }

/* Valid quantifier exists */

while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
p++;
yield = TRUE;
if (minp != NULL) *minp = (uint32_t)min;
if (maxp != NULL) *maxp = (uint32_t)max;

/* Update the pattern pointer */

EXIT:
*ptrptr = p;
return yield;
}